

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O3

String * __thiscall Bstrlib::String::operator=(String *this,char *s)

{
  uchar *__dest;
  size_t sVar1;
  int iVar2;
  char *__s;
  int length;
  
  iVar2 = (this->super_tagbstring).mlen;
  if (iVar2 < 1) {
    fprintf(_stderr,"[FATAL ERROR] %s:%d => %s",
            "/workspace/llm4binary/github/license_c_cmakelists/X-Ryl669[P]eMQTT5/tests/ClassPath/src/bstrwrap.cpp"
            ,0x10c,"Write protection error");
    iVar2 = (this->super_tagbstring).mlen;
  }
  __s = "";
  if (s != (char *)0x0) {
    __s = s;
  }
  sVar1 = strlen(__s);
  length = (int)sVar1;
  if (iVar2 <= length) {
    Alloc(this,length);
  }
  __dest = (this->super_tagbstring).data;
  if (__dest == (uchar *)0x0) {
    (this->super_tagbstring).mlen = 0;
    (this->super_tagbstring).slen = 0;
    fprintf(_stderr,"[FATAL ERROR] %s:%d => %s",
            "/workspace/llm4binary/github/license_c_cmakelists/X-Ryl669[P]eMQTT5/tests/ClassPath/src/bstrwrap.cpp"
            ,0x118,"Failure in =(const char *) operator");
  }
  else {
    (this->super_tagbstring).slen = length;
    memcpy(__dest,__s,(long)(length + 1));
  }
  return this;
}

Assistant:

const String& String::operator=(const char *s)
    {
        int tmpSlen;
        if (mlen <= 0)    bstringThrow("Write protection error");
        if (NULL == s)    s = "";
        if ((tmpSlen = (int)strlen(s)) >= mlen)    Alloc(tmpSlen);

        if (data)
        {
            slen = tmpSlen;
            memcpy(data, s, tmpSlen + 1);
        }
        else
        {
            mlen = slen = 0;
            bstringThrow("Failure in =(const char *) operator");
        }
        return *this;
    }